

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OS.cpp
# Opt level: O1

error_code slang::OS::readFile(path *path,SmallVector<char,_40UL> *buffer)

{
  uint uVar1;
  int iVar2;
  int __fd;
  int iVar3;
  uint *puVar4;
  ssize_t sVar5;
  error_category *peVar6;
  size_t __nbytes;
  ulong uVar7;
  ulong uVar8;
  pointer __buf;
  long lVar9;
  bool bVar10;
  error_code eVar11;
  stat status;
  DefaultInitTag local_d5;
  int local_d4;
  error_category *local_d0;
  SmallVectorBase<char> *local_c8;
  stat local_c0;
  
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&path->_M_pathname,"-");
  if (iVar2 == 0) {
    __fd = 0;
LAB_002b233a:
    peVar6 = (error_category *)std::_V2::system_category();
    iVar3 = fstat(__fd,&local_c0);
    if (iVar3 == 0) {
      local_d4 = iVar2;
      local_d0 = peVar6;
      local_c8 = &buffer->super_SmallVectorBase<char>;
      if (((local_c0.st_mode & 0xf000) == 0x6000) || ((local_c0.st_mode & 0xf000) == 0x8000)) {
        SmallVectorBase<char>::resizeImpl<slang::SmallVectorBase<char>::DefaultInitTag>
                  (&buffer->super_SmallVectorBase<char>,local_c0.st_size + 1,&local_d5);
        __buf = (buffer->super_SmallVectorBase<char>).data_;
        uVar8 = 0;
        uVar7 = local_c0.st_size;
        do {
          if (uVar7 == 0) break;
          __nbytes = 0x7fffffff;
          if (uVar7 < 0x7fffffff) {
            __nbytes = uVar7;
          }
          sVar5 = read(__fd,__buf,__nbytes);
          if (sVar5 < 0) {
            puVar4 = (uint *)__errno_location();
            uVar1 = *puVar4;
            bVar10 = uVar1 != 4;
            buffer = (SmallVector<char,_40UL> *)local_c8;
            if (bVar10) {
              local_d0 = (error_category *)std::_V2::generic_category();
              uVar8 = (ulong)uVar1;
              buffer = (SmallVector<char,_40UL> *)local_c8;
            }
          }
          else {
            __buf = __buf + sVar5;
            uVar7 = uVar7 - sVar5;
            if (sVar5 == 0) {
              SmallVectorBase<char>::resizeImpl<slang::SmallVectorBase<char>::ValueInitTag>
                        (&buffer->super_SmallVectorBase<char>,
                         (size_type)
                         (__buf + (1 - (long)(buffer->super_SmallVectorBase<char>).data_)),
                         (ValueInitTag *)&local_d5);
              bVar10 = true;
            }
            else {
              bVar10 = false;
            }
          }
        } while (!bVar10);
      }
      else {
        uVar8 = 0;
        lVar9 = 0;
        do {
          SmallVectorBase<char>::resizeImpl<slang::SmallVectorBase<char>::DefaultInitTag>
                    (&buffer->super_SmallVectorBase<char>,lVar9 + 0x4001,&local_d5);
          sVar5 = read(__fd,(buffer->super_SmallVectorBase<char>).data_ + lVar9,0x4000);
          if (sVar5 < 0) {
            puVar4 = (uint *)__errno_location();
            uVar1 = *puVar4;
            bVar10 = uVar1 != 4;
            buffer = (SmallVector<char,_40UL> *)local_c8;
            if (bVar10) {
              local_d0 = (error_category *)std::_V2::generic_category();
              uVar8 = (ulong)uVar1;
              buffer = (SmallVector<char,_40UL> *)local_c8;
            }
          }
          else {
            lVar9 = lVar9 + sVar5;
            bVar10 = sVar5 == 0;
          }
        } while (!bVar10);
        SmallVectorBase<char>::resizeImpl<slang::SmallVectorBase<char>::ValueInitTag>
                  (&buffer->super_SmallVectorBase<char>,lVar9 + 1,(ValueInitTag *)&local_d5);
      }
      ((SmallVectorBase<char> *)&(buffer->super_SmallVectorBase<char>).data_)->data_
      [(buffer->super_SmallVectorBase<char>).len - 1] = '\0';
      peVar6 = local_d0;
      iVar2 = local_d4;
    }
    else {
      puVar4 = (uint *)__errno_location();
      uVar8 = (ulong)*puVar4;
      peVar6 = (error_category *)std::_V2::generic_category();
    }
    if (((iVar2 == 0) || (iVar2 = close(__fd), -1 < iVar2)) || ((int)uVar8 != 0)) goto LAB_002b24f2;
    puVar4 = (uint *)__errno_location();
    uVar1 = *puVar4;
  }
  else {
    do {
      __fd = open((path->_M_pathname)._M_dataplus._M_p,0x80000);
      if (-1 < __fd) goto LAB_002b233a;
      puVar4 = (uint *)__errno_location();
      uVar1 = *puVar4;
    } while (uVar1 == 4);
  }
  uVar8 = (ulong)uVar1;
  peVar6 = (error_category *)std::_V2::generic_category();
LAB_002b24f2:
  eVar11._M_cat = peVar6;
  eVar11._0_8_ = uVar8;
  return eVar11;
}

Assistant:

std::error_code OS::readFile(const fs::path& path, SmallVector<char>& buffer) {
    int fd;
    auto& pathStr = path.native();
    const bool isStdin = pathStr == "-";

    if (isStdin) {
        fd = STDIN_FILENO;
    }
    else {
        while (true) {
            fd = ::open(pathStr.c_str(), O_RDONLY | O_CLOEXEC);
            if (fd >= 0)
                break;

            if (errno != EINTR)
                return std::error_code(errno, std::generic_category());
        }
    }

    std::error_code ec;
    struct stat status;
    if (::fstat(fd, &status) != 0) {
        ec.assign(errno, std::generic_category());
    }
    else if (S_ISREG(status.st_mode) || S_ISBLK(status.st_mode)) {
        auto fileSize = (size_t)status.st_size;
        buffer.resize_for_overwrite(fileSize + 1);

        char* buf = buffer.data();
        while (fileSize) {
            size_t bytesToRead = std::min(fileSize, size_t(INT32_MAX));
            ssize_t numRead = ::read(fd, buf, bytesToRead);
            if (numRead < 0) {
                if (errno == EINTR)
                    continue;

                ec.assign(errno, std::generic_category());
                break;
            }

            buf += numRead;
            fileSize -= (size_t)numRead;
            if (numRead == 0) {
                // We reached the end of the file early -- it must have been
                // truncated by someone else.
                buffer.resize(size_t(buf - buffer.data()) + 1);
                break;
            }
        }

        buffer.back() = '\0';
    }
    else {
        static constexpr size_t ChunkSize = 4 * 4096;

        size_t currSize = 0;
        while (true) {
            buffer.resize_for_overwrite(currSize + ChunkSize + 1);

            ssize_t numRead = ::read(fd, buffer.data() + currSize, ChunkSize);
            if (numRead < 0) {
                if (errno == EINTR)
                    continue;

                ec.assign(errno, std::generic_category());
                break;
            }

            currSize += (size_t)numRead;
            if (numRead == 0)
                break;
        }

        buffer.resize(currSize + 1);
        buffer.back() = '\0';
    }

    if (!isStdin) {
        if (::close(fd) < 0 && !ec)
            ec.assign(errno, std::generic_category());
    }

    return ec;
}